

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

size_t bin_text_write(io_buf *io,char *data,size_t len,stringstream *msg,bool text)

{
  size_t sVar1;
  string *in_RCX;
  byte in_R8B;
  size_t temp;
  char *in_stack_ffffffffffffff18;
  io_buf *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  allocator *paVar2;
  io_buf *in_stack_ffffffffffffff30;
  allocator local_a9;
  string local_a8 [48];
  string local_78 [32];
  string local_58 [32];
  size_t local_38;
  byte local_29;
  string *local_28;
  size_t local_8;
  
  local_29 = in_R8B & 1;
  if (local_29 == 0) {
    local_8 = bin_write(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0);
  }
  else {
    local_28 = in_RCX;
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    std::__cxx11::string::size();
    sVar1 = io_buf::bin_write_fixed
                      (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                       (size_t)in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
    paVar2 = &local_a9;
    local_38 = sVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"",paVar2);
    std::__cxx11::stringstream::str(local_28);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

inline size_t bin_text_write(io_buf& io, char* data, size_t len, std::stringstream& msg, bool text)
{
  if (text)
  {
    size_t temp = io.bin_write_fixed(msg.str().c_str(), msg.str().size());
    msg.str("");
    return temp;
  }
  else
    return bin_write(io, data, (uint32_t)len);
  return 0;
}